

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueTest.hpp
# Opt level: O2

void Qentem::Test::TestGroupValue(QTest *test)

{
  bool bVar1;
  Value<char> *pVVar2;
  StringStream<char> *pSVar3;
  ValueC value2;
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
  local_68;
  StringStream<char> ss;
  ValueC value;
  
  ss.storage_ = (char *)0x0;
  ss.length_ = 0;
  ss.capacity_ = 0;
  value.type_ = Undefined;
  value.field_0.array_.storage_ = (Value<char> *)0x0;
  value.field_0._8_8_ = 0;
  value2.field_0.array_.storage_ = (Value<char> *)0x0;
  value2.field_0._8_8_ = 0;
  Value<char>::operator+=(&value,(ObjectT *)&value2);
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  ~HashTable((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              *)&value2);
  value2.field_0.array_.storage_ = (Value<char> *)0x0;
  value2.field_0._8_8_ = 0;
  Value<char>::operator+=(&value,(ObjectT *)&value2);
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  ~HashTable((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              *)&value2);
  value2.field_0.array_.storage_ = (Value<char> *)0x0;
  value2.field_0._8_8_ = 0;
  Value<char>::operator+=(&value,(ObjectT *)&value2);
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  ~HashTable((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              *)&value2);
  value2.field_0.array_.storage_ = (Value<char> *)0x0;
  value2.field_0._8_8_ = 0;
  Value<char>::operator+=(&value,(ObjectT *)&value2);
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  ~HashTable((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              *)&value2);
  value2.field_0.array_.storage_ = (Value<char> *)0x0;
  value2.field_0._8_8_ = 0;
  Value<char>::operator+=(&value,(ObjectT *)&value2);
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  ~HashTable((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              *)&value2);
  value2.field_0.array_.storage_ = (Value<char> *)0x0;
  value2.field_0._8_8_ = 0;
  Value<char>::operator+=(&value,(ObjectT *)&value2);
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  ~HashTable((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              *)&value2);
  value2.field_0.array_.storage_ = (Value<char> *)0x0;
  value2.field_0._8_8_ = 0;
  Value<char>::operator+=(&value,(ObjectT *)&value2);
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  ~HashTable((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              *)&value2);
  pVVar2 = Value<char>::operator[](&value,0);
  pVVar2 = Value<char>::operator[](pVVar2,"year");
  Value<char>::operator=(pVVar2,0x7e3);
  pVVar2 = Value<char>::operator[](&value,1);
  pVVar2 = Value<char>::operator[](pVVar2,"year");
  Value<char>::operator=(pVVar2,0x7e4);
  pVVar2 = Value<char>::operator[](&value,2);
  pVVar2 = Value<char>::operator[](pVVar2,"year");
  Value<char>::operator=(pVVar2,0x7e1);
  pVVar2 = Value<char>::operator[](&value,3);
  pVVar2 = Value<char>::operator[](pVVar2,"year");
  Value<char>::operator=(pVVar2,0x7e4);
  pVVar2 = Value<char>::operator[](&value,4);
  pVVar2 = Value<char>::operator[](pVVar2,"year");
  Value<char>::operator=(pVVar2,0x7e2);
  pVVar2 = Value<char>::operator[](&value,5);
  pVVar2 = Value<char>::operator[](pVVar2,"year");
  Value<char>::operator=(pVVar2,0x7e4);
  pVVar2 = Value<char>::operator[](&value,6);
  pVVar2 = Value<char>::operator[](pVVar2,"year");
  Value<char>::operator=(pVVar2,0x7e2);
  pVVar2 = Value<char>::operator[](&value,0);
  pVVar2 = Value<char>::operator[](pVVar2,"month");
  Value<char>::operator=(pVVar2,4);
  pVVar2 = Value<char>::operator[](&value,1);
  pVVar2 = Value<char>::operator[](pVVar2,"month");
  Value<char>::operator=(pVVar2,5);
  pVVar2 = Value<char>::operator[](&value,2);
  pVVar2 = Value<char>::operator[](pVVar2,"month");
  Value<char>::operator=(pVVar2,1);
  pVVar2 = Value<char>::operator[](&value,3);
  pVVar2 = Value<char>::operator[](pVVar2,"month");
  Value<char>::operator=(pVVar2,6);
  pVVar2 = Value<char>::operator[](&value,4);
  pVVar2 = Value<char>::operator[](pVVar2,"month");
  Value<char>::operator=(pVVar2,2);
  pVVar2 = Value<char>::operator[](&value,5);
  pVVar2 = Value<char>::operator[](pVVar2,"month");
  Value<char>::operator=(pVVar2,7);
  pVVar2 = Value<char>::operator[](&value,6);
  pVVar2 = Value<char>::operator[](pVVar2,"month");
  Value<char>::operator=(pVVar2,3);
  value2.type_ = Undefined;
  value2.field_0.array_.storage_ = (Value<char> *)0x0;
  value2.field_0._8_8_ = 0;
  Value<char>::GroupBy(&value,&value2,"year");
  Value<char>::Sort(&value2,true);
  pSVar3 = Value<char>::Stringify<Qentem::StringStream<char>>(&value2,&ss,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[122]>
            (test,pSVar3,
             (char (*) [122])
             "{\"2017\":[{\"month\":1}],\"2018\":[{\"month\":2},{\"month\":3}],\"2019\":[{\"month\":4}],\"2020\":[{\"month\":5},{\"month\":6},{\"month\":7}]}"
             ,0x1663);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  Value<char>::Sort(&value2,false);
  pSVar3 = Value<char>::Stringify<Qentem::StringStream<char>>(&value2,&ss,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[122]>
            (test,pSVar3,
             (char (*) [122])
             "{\"2020\":[{\"month\":5},{\"month\":6},{\"month\":7}],\"2019\":[{\"month\":4}],\"2018\":[{\"month\":2},{\"month\":3}],\"2017\":[{\"month\":1}]}"
             ,0x166b);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  Value<char>::Reset(&value);
  Value<char>::Reset(&value2);
  Value<char>::GroupBy(&value,&value2,"year");
  pSVar3 = Value<char>::Stringify<Qentem::StringStream<char>>(&value2,&ss,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[1]>(test,pSVar3,(char (*) [1])0x12e25d,0x1671);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pVVar2 = Value<char>::operator[](&value,0);
  pVVar2 = Value<char>::operator[](pVVar2,"year1");
  Value<char>::operator=(pVVar2,0x7e3);
  pVVar2 = Value<char>::operator[](&value,1);
  pVVar2 = Value<char>::operator[](pVVar2,"year1");
  Value<char>::operator=(pVVar2,0x7e4);
  pVVar2 = Value<char>::operator[](&value,2);
  pVVar2 = Value<char>::operator[](pVVar2,"year1");
  Value<char>::operator=(pVVar2,0x7e1);
  pVVar2 = Value<char>::operator[](&value,3);
  pVVar2 = Value<char>::operator[](pVVar2,"year1");
  Value<char>::operator=(pVVar2,0x7e4);
  pVVar2 = Value<char>::operator[](&value,4);
  pVVar2 = Value<char>::operator[](pVVar2,"year1");
  Value<char>::operator=(pVVar2,0x7e2);
  pVVar2 = Value<char>::operator[](&value,5);
  pVVar2 = Value<char>::operator[](pVVar2,"year1");
  Value<char>::operator=(pVVar2,0x7e4);
  pVVar2 = Value<char>::operator[](&value,6);
  pVVar2 = Value<char>::operator[](pVVar2,"year1");
  Value<char>::operator=(pVVar2,0x7e2);
  pVVar2 = Value<char>::operator[](&value,0);
  pVVar2 = Value<char>::operator[](pVVar2,"month");
  Value<char>::operator=(pVVar2,4);
  pVVar2 = Value<char>::operator[](&value,1);
  pVVar2 = Value<char>::operator[](pVVar2,"month");
  Value<char>::operator=(pVVar2,5);
  pVVar2 = Value<char>::operator[](&value,2);
  pVVar2 = Value<char>::operator[](pVVar2,"month");
  Value<char>::operator=(pVVar2,1);
  pVVar2 = Value<char>::operator[](&value,3);
  pVVar2 = Value<char>::operator[](pVVar2,"month");
  Value<char>::operator=(pVVar2,6);
  pVVar2 = Value<char>::operator[](&value,4);
  pVVar2 = Value<char>::operator[](pVVar2,"month");
  Value<char>::operator=(pVVar2,2);
  pVVar2 = Value<char>::operator[](&value,5);
  pVVar2 = Value<char>::operator[](pVVar2,"month");
  Value<char>::operator=(pVVar2,7);
  pVVar2 = Value<char>::operator[](&value,6);
  pVVar2 = Value<char>::operator[](pVVar2,"month");
  Value<char>::operator=(pVVar2,3);
  Value<char>::GroupBy(&value,&value2,"year");
  pSVar3 = Value<char>::Stringify<Qentem::StringStream<char>>(&value2,&ss,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[3]>(test,pSVar3,(char (*) [3])"{}",0x1685);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  Value<char>::Reset(&value);
  pVVar2 = Value<char>::operator[](&value,0);
  pVVar2 = Value<char>::operator[](pVVar2,"year");
  Value<char>::operator=(pVVar2,0x7e3);
  pVVar2 = Value<char>::operator[](&value,1);
  pVVar2 = Value<char>::operator[](pVVar2,"year");
  Value<char>::operator=(pVVar2,0x7e4);
  pVVar2 = Value<char>::operator[](&value,2);
  Value<char>::operator[](pVVar2,"year");
  pVVar2 = Value<char>::operator[](&value,0);
  pVVar2 = Value<char>::operator[](pVVar2,"month");
  Value<char>::operator=(pVVar2,4);
  pVVar2 = Value<char>::operator[](&value,1);
  pVVar2 = Value<char>::operator[](pVVar2,"month");
  Value<char>::operator=(pVVar2,5);
  pVVar2 = Value<char>::operator[](&value,2);
  pVVar2 = Value<char>::operator[](pVVar2,"month");
  Value<char>::operator=(pVVar2,1);
  bVar1 = Value<char>::GroupBy(&value,&value2,"year");
  QTest::IsFalse(test,bVar1,0x1693);
  pVVar2 = Value<char>::operator[](&value,2);
  Value<char>::Reset(pVVar2);
  Value<char>::GroupBy(&value,&value2,"year");
  bVar1 = Value<char>::GroupBy(&value,&value2,"year");
  QTest::IsFalse(test,bVar1,0x1697);
  local_68.hashTable_ = (SizeT *)0x0;
  local_68.index_ = 0;
  local_68.capacity_ = 0;
  pVVar2 = Value<char>::operator[](&value,2);
  pVVar2 = Value<char>::operator[](pVVar2,"year");
  Value<char>::operator=(pVVar2,(ObjectT *)&local_68);
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  ~HashTable(&local_68);
  bVar1 = Value<char>::GroupBy(&value,&value2,"year");
  QTest::IsFalse(test,bVar1,0x169a);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  Value<char>::Reset(&value);
  Value<char>::Reset(&value2);
  Value<char>::operator+=(&value2,4);
  Value<char>::operator+=(&value2,1);
  Value<char>::operator+=(&value2,3);
  Value<char>::operator+=(&value2,5);
  Value<char>::operator+=(&value2,2);
  Value<char>::operator+=(&value2,7);
  Value<char>::operator+=(&value2,6);
  Value<char>::operator=(&value,&value2);
  Value<char>::Sort(&value,true);
  pSVar3 = Value<char>::Stringify<Qentem::StringStream<char>>(&value,&ss,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[16]>
            (test,pSVar3,(char (*) [16])"[1,2,3,4,5,6,7]",0x16ad);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  Value<char>::operator=(&value,&value2);
  Value<char>::Sort(&value,false);
  pSVar3 = Value<char>::Stringify<Qentem::StringStream<char>>(&value,&ss,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[16]>
            (test,pSVar3,(char (*) [16])"[7,6,5,4,3,2,1]",0x16b4);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  Value<char>::Reset(&value);
  Value<char>::Reset(&value2);
  Value<char>::operator+=(&value2,5.4);
  Value<char>::operator+=(&value2,"str");
  local_68.hashTable_ = (SizeT *)0x0;
  local_68.index_ = 0;
  local_68.capacity_ = 0;
  Value<char>::operator+=(&value2,(ArrayT *)&local_68);
  Array<Qentem::Value<char>_>::~Array((Array<Qentem::Value<char>_> *)&local_68);
  Value<char>::operator+=(&value2,(NullType)0x0);
  Value<char>::operator+=(&value2,true);
  local_68.hashTable_ = (SizeT *)0x0;
  local_68.index_ = 0;
  local_68.capacity_ = 0;
  Value<char>::operator+=(&value2,(ObjectT *)&local_68);
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  ~HashTable(&local_68);
  Value<char>::operator+=(&value2,false);
  Value<char>::operator=(&value,&value2);
  Value<char>::Sort(&value,true);
  pSVar3 = Value<char>::Stringify<Qentem::StringStream<char>>(&value,&ss,2);
  QTest::IsEqual<Qentem::StringStream<char>,char[34]>
            (test,pSVar3,(char (*) [34])"[{},[],\"str\",5.4,true,false,null]",0x16c7);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  Value<char>::operator=(&value,&value2);
  Value<char>::Sort(&value,false);
  pSVar3 = Value<char>::Stringify<Qentem::StringStream<char>>(&value,&ss,2);
  QTest::IsEqual<Qentem::StringStream<char>,char[34]>
            (test,pSVar3,(char (*) [34])"[null,false,true,5.4,\"str\",[],{}]",0x16cd);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  Value<char>::Reset(&value);
  Value<char>::Reset(&value2);
  Value<char>::operator+=(&value2,-4);
  Value<char>::operator+=(&value2,-1);
  Value<char>::operator+=(&value2,-3);
  Value<char>::operator+=(&value2,-5);
  Value<char>::operator+=(&value2,-2);
  Value<char>::operator+=(&value2,-7);
  Value<char>::operator+=(&value2,-6);
  Value<char>::operator=(&value,&value2);
  Value<char>::Sort(&value,true);
  pSVar3 = Value<char>::Stringify<Qentem::StringStream<char>>(&value,&ss,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[23]>
            (test,pSVar3,(char (*) [23])"[-7,-6,-5,-4,-3,-2,-1]",0x16e0);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  Value<char>::operator=(&value,&value2);
  Value<char>::Sort(&value,false);
  pSVar3 = Value<char>::Stringify<Qentem::StringStream<char>>(&value,&ss,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[23]>
            (test,pSVar3,(char (*) [23])"[-1,-2,-3,-4,-5,-6,-7]",0x16e7);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  Value<char>::Reset(&value);
  Value<char>::Reset(&value2);
  Value<char>::operator+=(&value2,4.5);
  Value<char>::operator+=(&value2,1.5);
  Value<char>::operator+=(&value2,3.5);
  Value<char>::operator+=(&value2,5.5);
  Value<char>::operator+=(&value2,2.5);
  Value<char>::operator+=(&value2,7.5);
  Value<char>::operator+=(&value2,6.5);
  Value<char>::operator=(&value,&value2);
  Value<char>::Sort(&value,true);
  pSVar3 = Value<char>::Stringify<Qentem::StringStream<char>>(&value,&ss,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[30]>
            (test,pSVar3,(char (*) [30])"[1.5,2.5,3.5,4.5,5.5,6.5,7.5]",0x16fa);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  Value<char>::operator=(&value,&value2);
  Value<char>::Sort(&value,false);
  pSVar3 = Value<char>::Stringify<Qentem::StringStream<char>>(&value,&ss,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[30]>
            (test,pSVar3,(char (*) [30])"[7.5,6.5,5.5,4.5,3.5,2.5,1.5]",0x1701);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  Value<char>::Reset(&value);
  Value<char>::Reset(&value2);
  Value<char>::operator+=(&value2,"b");
  Value<char>::operator+=(&value2,"a");
  Value<char>::operator+=(&value2,"g");
  Value<char>::operator+=(&value2,"f");
  Value<char>::operator+=(&value2,"c");
  Value<char>::operator+=(&value2,"e");
  Value<char>::operator+=(&value2,"d");
  Value<char>::operator=(&value,&value2);
  Value<char>::Sort(&value,true);
  pSVar3 = Value<char>::Stringify<Qentem::StringStream<char>>(&value,&ss,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[30]>
            (test,pSVar3,(char (*) [30])"[\"a\",\"b\",\"c\",\"d\",\"e\",\"f\",\"g\"]",0x1713);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  Value<char>::operator=(&value,&value2);
  Value<char>::Sort(&value,false);
  pSVar3 = Value<char>::Stringify<Qentem::StringStream<char>>(&value,&ss,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[30]>
            (test,pSVar3,(char (*) [30])"[\"g\",\"f\",\"e\",\"d\",\"c\",\"b\",\"a\"]",0x171a);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  Value<char>::Reset(&value);
  Value<char>::Reset(&value2);
  Value<char>::operator+=(&value2,0);
  Value<char>::operator+=(&value2,0);
  Value<char>::operator+=(&value2,0);
  pVVar2 = Value<char>::operator[](&value,0);
  Value<char>::operator=(pVVar2,&value2);
  Value<char>::operator+=(&value2,0);
  Value<char>::operator+=(&value2,0);
  pVVar2 = Value<char>::operator[](&value,1);
  Value<char>::operator=(pVVar2,&value2);
  Value<char>::Sort(&value,true);
  pSVar3 = Value<char>::Stringify<Qentem::StringStream<char>>(&value,&ss,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[22]>
            (test,pSVar3,(char (*) [22])"[[0,0,0],[0,0,0,0,0]]",0x172d);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  Value<char>::Reset(&value);
  Value<char>::Reset(&value2);
  Value<char>::operator+=(&value2,0);
  Value<char>::operator+=(&value2,0);
  Value<char>::operator+=(&value2,0);
  pVVar2 = Value<char>::operator[](&value,0);
  Value<char>::operator=(pVVar2,&value2);
  Value<char>::operator+=(&value2,0);
  Value<char>::operator+=(&value2,0);
  pVVar2 = Value<char>::operator[](&value,1);
  Value<char>::operator=(pVVar2,&value2);
  Value<char>::Sort(&value,false);
  pSVar3 = Value<char>::Stringify<Qentem::StringStream<char>>(&value,&ss,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[22]>
            (test,pSVar3,(char (*) [22])"[[0,0,0,0,0],[0,0,0]]",0x173e);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  Value<char>::Reset(&value);
  Value<char>::Reset(&value2);
  pVVar2 = Value<char>::operator[](&value2,"a");
  Value<char>::operator=(pVVar2,0);
  pVVar2 = Value<char>::operator[](&value2,"b");
  Value<char>::operator=(pVVar2,0);
  pVVar2 = Value<char>::operator[](&value2,"c");
  Value<char>::operator=(pVVar2,0);
  pVVar2 = Value<char>::operator[](&value,0);
  Value<char>::operator=(pVVar2,&value2);
  pVVar2 = Value<char>::operator[](&value2,"d");
  Value<char>::operator=(pVVar2,0);
  pVVar2 = Value<char>::operator[](&value2,"e");
  Value<char>::operator=(pVVar2,0);
  pVVar2 = Value<char>::operator[](&value,1);
  Value<char>::operator=(pVVar2,&value2);
  Value<char>::Sort(&value,true);
  pSVar3 = Value<char>::Stringify<Qentem::StringStream<char>>(&value,&ss,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[54]>
            (test,pSVar3,
             (char (*) [54])"[{\"a\":0,\"b\":0,\"c\":0},{\"a\":0,\"b\":0,\"c\":0,\"d\":0,\"e\":0}]",
             0x1751);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  Value<char>::Reset(&value);
  Value<char>::Reset(&value2);
  pVVar2 = Value<char>::operator[](&value2,"a");
  Value<char>::operator=(pVVar2,0);
  pVVar2 = Value<char>::operator[](&value2,"b");
  Value<char>::operator=(pVVar2,0);
  pVVar2 = Value<char>::operator[](&value2,"c");
  Value<char>::operator=(pVVar2,0);
  pVVar2 = Value<char>::operator[](&value,0);
  Value<char>::operator=(pVVar2,&value2);
  pVVar2 = Value<char>::operator[](&value2,"d");
  Value<char>::operator=(pVVar2,0);
  pVVar2 = Value<char>::operator[](&value2,"e");
  Value<char>::operator=(pVVar2,0);
  pVVar2 = Value<char>::operator[](&value,1);
  Value<char>::operator=(pVVar2,&value2);
  Value<char>::Sort(&value,false);
  pSVar3 = Value<char>::Stringify<Qentem::StringStream<char>>(&value,&ss,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[54]>
            (test,pSVar3,
             (char (*) [54])"[{\"a\":0,\"b\":0,\"c\":0,\"d\":0,\"e\":0},{\"a\":0,\"b\":0,\"c\":0}]",
             0x1762);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  Value<char>::Reset(&value);
  Value<char>::Reset(&value2);
  Value<char>::operator+=(&value2,true);
  Value<char>::operator+=(&value2,true);
  Value<char>::operator=(&value,&value2);
  Value<char>::Sort(&value,true);
  pSVar3 = Value<char>::Stringify<Qentem::StringStream<char>>(&value,&ss,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[12]>
            (test,pSVar3,(char (*) [12])"[true,true]",0x1772);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  Value<char>::operator=(&value,&value2);
  Value<char>::Sort(&value,false);
  pSVar3 = Value<char>::Stringify<Qentem::StringStream<char>>(&value,&ss,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[12]>
            (test,pSVar3,(char (*) [12])"[true,true]",0x1779);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  Value<char>::Reset(&value);
  Value<char>::Reset(&value2);
  Value<char>::operator+=(&value2,false);
  Value<char>::operator+=(&value2,false);
  Value<char>::operator=(&value,&value2);
  Value<char>::Sort(&value,true);
  pSVar3 = Value<char>::Stringify<Qentem::StringStream<char>>(&value,&ss,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[14]>
            (test,pSVar3,(char (*) [14])"[false,false]",0x1787);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  Value<char>::operator=(&value,&value2);
  Value<char>::Sort(&value,false);
  pSVar3 = Value<char>::Stringify<Qentem::StringStream<char>>(&value,&ss,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[14]>
            (test,pSVar3,(char (*) [14])"[false,false]",0x178e);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  Value<char>::Reset(&value);
  Value<char>::Reset(&value2);
  Value<char>::operator+=(&value2,(NullType)0x0);
  Value<char>::operator+=(&value2,(NullType)0x0);
  Value<char>::operator=(&value,&value2);
  Value<char>::Sort(&value,true);
  pSVar3 = Value<char>::Stringify<Qentem::StringStream<char>>(&value,&ss,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[12]>
            (test,pSVar3,(char (*) [12])"[null,null]",0x179b);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  Value<char>::operator=(&value,&value2);
  Value<char>::Sort(&value,false);
  pSVar3 = Value<char>::Stringify<Qentem::StringStream<char>>(&value,&ss,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[12]>
            (test,pSVar3,(char (*) [12])"[null,null]",0x17a2);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  Value<char>::RemoveIndex(&value,0);
  Value<char>::RemoveIndex(&value,1);
  Value<char>::Sort(&value,true);
  pSVar3 = Value<char>::Stringify<Qentem::StringStream<char>>(&value,&ss,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[3]>(test,pSVar3,(char (*) [3])"[]",0x17aa);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  Value<char>::Sort(&value,false);
  pSVar3 = Value<char>::Stringify<Qentem::StringStream<char>>(&value,&ss,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[3]>(test,pSVar3,(char (*) [3])"[]",0x17af);
  Value<char>::~Value(&value2);
  Value<char>::~Value(&value);
  Memory::Deallocate(ss.storage_);
  return;
}

Assistant:

static void TestGroupValue(QTest &test) {
    StringStream<char> ss;
    ValueC             value;

    value += VHArray{};
    value += VHArray{};
    value += VHArray{};
    value += VHArray{};
    value += VHArray{};
    value += VHArray{};
    value += VHArray{};

    value[0]["year"] = 2019;
    value[1]["year"] = 2020;
    value[2]["year"] = 2017;
    value[3]["year"] = 2020;
    value[4]["year"] = 2018;
    value[5]["year"] = 2020;
    value[6]["year"] = 2018;

    value[0]["month"] = 4;
    value[1]["month"] = 5;
    value[2]["month"] = 1;
    value[3]["month"] = 6;
    value[4]["month"] = 2;
    value[5]["month"] = 7;
    value[6]["month"] = 3;

    ValueC value2;
    value.GroupBy(value2, "year");
    value2.Sort();

    test.IsEqual(
        value2.Stringify(ss),
        R"({"2017":[{"month":1}],"2018":[{"month":2},{"month":3}],"2019":[{"month":4}],"2020":[{"month":5},{"month":6},{"month":7}]})",
        __LINE__);
    ss.Clear();

    value2.Sort(false);

    test.IsEqual(
        value2.Stringify(ss),
        R"({"2020":[{"month":5},{"month":6},{"month":7}],"2019":[{"month":4}],"2018":[{"month":2},{"month":3}],"2017":[{"month":1}]})",
        __LINE__);
    ss.Clear();

    value.Reset();
    value2.Reset();
    value.GroupBy(value2, "year");
    test.IsEqual(value2.Stringify(ss), R"()", __LINE__);
    ss.Clear();

    value[0]["year1"] = 2019;
    value[1]["year1"] = 2020;
    value[2]["year1"] = 2017;
    value[3]["year1"] = 2020;
    value[4]["year1"] = 2018;
    value[5]["year1"] = 2020;
    value[6]["year1"] = 2018;

    value[0]["month"] = 4;
    value[1]["month"] = 5;
    value[2]["month"] = 1;
    value[3]["month"] = 6;
    value[4]["month"] = 2;
    value[5]["month"] = 7;
    value[6]["month"] = 3;

    value.GroupBy(value2, "year");
    test.IsEqual(value2.Stringify(ss), R"({})", __LINE__);
    ss.Clear();
    ////

    value.Reset();

    value[0]["year"] = 2019;
    value[1]["year"] = 2020;
    value[2]["year"];

    value[0]["month"] = 4;
    value[1]["month"] = 5;
    value[2]["month"] = 1;

    test.IsFalse(value.GroupBy(value2, "year"), __LINE__);

    value[2].Reset();
    value.GroupBy(value2, "year");
    test.IsFalse(value.GroupBy(value2, "year"), __LINE__);

    value[2]["year"] = VHArray{};
    test.IsFalse(value.GroupBy(value2, "year"), __LINE__);

    ///////////////////
    ss.Clear();

    value.Reset();
    value2.Reset();

    value2 += unsigned{4};
    value2 += unsigned{1};
    value2 += unsigned{3};
    value2 += unsigned{5};
    value2 += unsigned{2};
    value2 += unsigned{7};
    value2 += unsigned{6};

    value = value2;
    value.Sort();

    test.IsEqual(value.Stringify(ss), R"([1,2,3,4,5,6,7])", __LINE__);
    ss.Clear();

    value = value2;

    value.Sort(false);

    test.IsEqual(value.Stringify(ss), R"([7,6,5,4,3,2,1])", __LINE__);
    ss.Clear();

    //////////////////////

    value.Reset();
    value2.Reset();

    value2 += 5.4;
    value2 += "str";
    value2 += VArray{};
    value2 += nullptr;
    value2 += true;
    value2 += VHArray{};
    value2 += false;

    value = value2;
    value.Sort();

    test.IsEqual(value.Stringify(ss, 2U), R"([{},[],"str",5.4,true,false,null])", __LINE__);
    ss.Clear();

    value = value2;
    value.Sort(false);

    test.IsEqual(value.Stringify(ss, 2U), R"([null,false,true,5.4,"str",[],{}])", __LINE__);
    ss.Clear();

    ///////////////////

    value.Reset();
    value2.Reset();

    value2 += -4;
    value2 += -1;
    value2 += -3;
    value2 += -5;
    value2 += -2;
    value2 += -7;
    value2 += -6;

    value = value2;
    value.Sort();

    test.IsEqual(value.Stringify(ss), R"([-7,-6,-5,-4,-3,-2,-1])", __LINE__);
    ss.Clear();

    value = value2;

    value.Sort(false);

    test.IsEqual(value.Stringify(ss), R"([-1,-2,-3,-4,-5,-6,-7])", __LINE__);
    ss.Clear();

    ///////////////////

    value.Reset();
    value2.Reset();

    value2 += 4.5;
    value2 += 1.5;
    value2 += 3.5;
    value2 += 5.5;
    value2 += 2.5;
    value2 += 7.5;
    value2 += 6.5;

    value = value2;
    value.Sort();

    test.IsEqual(value.Stringify(ss), R"([1.5,2.5,3.5,4.5,5.5,6.5,7.5])", __LINE__);
    ss.Clear();

    value = value2;

    value.Sort(false);

    test.IsEqual(value.Stringify(ss), R"([7.5,6.5,5.5,4.5,3.5,2.5,1.5])", __LINE__);
    ss.Clear();

    ///////////////////
    value.Reset();
    value2.Reset();

    value2 += "b";
    value2 += "a";
    value2 += "g";
    value2 += "f";
    value2 += "c";
    value2 += "e";
    value2 += "d";

    value = value2;
    value.Sort();

    test.IsEqual(value.Stringify(ss), R"(["a","b","c","d","e","f","g"])", __LINE__);
    ss.Clear();

    value = value2;

    value.Sort(false);

    test.IsEqual(value.Stringify(ss), R"(["g","f","e","d","c","b","a"])", __LINE__);
    ss.Clear();

    ///////////////////

    value.Reset();
    value2.Reset();

    value2 += 0;
    value2 += 0;
    value2 += 0;
    value[0] = value2;

    value2 += 0;
    value2 += 0;
    value[1] = value2;

    value.Sort();

    test.IsEqual(value.Stringify(ss), R"([[0,0,0],[0,0,0,0,0]])", __LINE__);
    ss.Clear();

    value.Reset();
    value2.Reset();

    value2 += 0;
    value2 += 0;
    value2 += 0;
    value[0] = value2;

    value2 += 0;
    value2 += 0;
    value[1] = value2;

    value.Sort(false);

    test.IsEqual(value.Stringify(ss), R"([[0,0,0,0,0],[0,0,0]])", __LINE__);

    ///////////////////
    ss.Clear();

    value.Reset();
    value2.Reset();

    value2["a"] = 0;
    value2["b"] = 0;
    value2["c"] = 0;
    value[0]    = value2;

    value2["d"] = 0;
    value2["e"] = 0;
    value[1]    = value2;

    value.Sort();

    test.IsEqual(value.Stringify(ss), R"([{"a":0,"b":0,"c":0},{"a":0,"b":0,"c":0,"d":0,"e":0}])", __LINE__);
    ss.Clear();

    value.Reset();
    value2.Reset();

    value2["a"] = 0;
    value2["b"] = 0;
    value2["c"] = 0;
    value[0]    = value2;

    value2["d"] = 0;
    value2["e"] = 0;
    value[1]    = value2;

    value.Sort(false);

    test.IsEqual(value.Stringify(ss), R"([{"a":0,"b":0,"c":0,"d":0,"e":0},{"a":0,"b":0,"c":0}])", __LINE__);

    //////////////////////

    ///////////////////
    ss.Clear();

    value.Reset();
    value2.Reset();

    value2 += true;
    value2 += true;

    value = value2;
    value.Sort();

    test.IsEqual(value.Stringify(ss), R"([true,true])", __LINE__);
    ss.Clear();

    value = value2;

    value.Sort(false);

    test.IsEqual(value.Stringify(ss), R"([true,true])", __LINE__);
    ss.Clear();

    //////////

    value.Reset();
    value2.Reset();

    value2 += false;
    value2 += false;

    value = value2;
    value.Sort();

    test.IsEqual(value.Stringify(ss), R"([false,false])", __LINE__);
    ss.Clear();

    value = value2;

    value.Sort(false);

    test.IsEqual(value.Stringify(ss), R"([false,false])", __LINE__);
    ///////////
    ss.Clear();

    value.Reset();
    value2.Reset();

    value2 += nullptr;
    value2 += nullptr;

    value = value2;
    value.Sort();

    test.IsEqual(value.Stringify(ss), R"([null,null])", __LINE__);
    ss.Clear();

    value = value2;

    value.Sort(false);

    test.IsEqual(value.Stringify(ss), R"([null,null])", __LINE__);
    ss.Clear();
    ///////////
    value.RemoveIndex(0);
    value.RemoveIndex(1);

    value.Sort();

    test.IsEqual(value.Stringify(ss), R"([])", __LINE__);
    ss.Clear();

    value.Sort(false);

    test.IsEqual(value.Stringify(ss), R"([])", __LINE__);
    ///////////////////
}